

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void recff_ffi_fill(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  TRef *pTVar2;
  TRef TVar3;
  TRef TVar4;
  TRef TVar5;
  ulong uVar6;
  ulong uVar7;
  CTSize step;
  TValue *sval;
  cTValue *pcVar8;
  CTState *cts;
  CTSize sz;
  CTSize local_34;
  
  pTVar2 = J->base;
  TVar3 = *pTVar2;
  TVar4 = pTVar2[1];
  if (TVar4 != 0 && TVar3 != 0) {
    cts = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
    TVar5 = pTVar2[2];
    sval = rd->argv;
    if ((sval->field_2).it == 0xfffffff5) {
      uVar6 = (ulong)*(ushort *)((ulong)(sval->u32).lo + 6);
      uVar7 = uVar6 * 0x10;
      uVar1 = cts->tab[uVar6].info;
      if ((uVar1 & 0xf0000000) == 0x20000000) {
        uVar7 = (ulong)((uVar1 & 0xffff) << 4);
      }
      lj_ctype_info(cts,(CTypeID)(uVar7 >> 4),&local_34);
      sval = rd->argv;
    }
    TVar3 = crec_ct_tv(J,cts->tab + 0x11,0,TVar3,sval);
    pcVar8 = rd->argv + 1;
    TVar4 = crec_ct_tv(J,cts->tab + 9,0,TVar4,pcVar8);
    step = (CTSize)pcVar8;
    if (TVar5 == 0) {
      TVar5 = lj_ir_kint(J,0);
    }
    else {
      pcVar8 = rd->argv + 2;
      TVar5 = crec_ct_tv(J,cts->tab + 9,0,TVar5,pcVar8);
      step = (CTSize)pcVar8;
    }
    rd->nres = 0;
    crec_fill(J,TVar3,TVar4,TVar5,step);
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_fill(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef trdst = J->base[0], trlen = J->base[1], trfill = J->base[2];
  if (trdst && trlen) {
    CTSize step = 1;
    if (tviscdata(&rd->argv[0])) {  /* Get alignment of original destination. */
      CTSize sz;
      CType *ct = ctype_raw(cts, cdataV(&rd->argv[0])->ctypeid);
      if (ctype_isptr(ct->info))
	ct = ctype_rawchild(cts, ct);
      step = (1u<<ctype_align(lj_ctype_info(cts, ctype_typeid(cts, ct), &sz)));
    }
    trdst = crec_ct_tv(J, ctype_get(cts, CTID_P_VOID), 0, trdst, &rd->argv[0]);
    trlen = crec_toint(J, cts, trlen, &rd->argv[1]);
    if (trfill)
      trfill = crec_toint(J, cts, trfill, &rd->argv[2]);
    else
      trfill = lj_ir_kint(J, 0);
    rd->nres = 0;
    crec_fill(J, trdst, trlen, trfill, step);
  }  /* else: interpreter will throw. */
}